

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTreeEdge.cpp
# Opt level: O0

void __thiscall
PhyloTreeEdge::PhyloTreeEdge
          (PhyloTreeEdge *this,double attrib,shared_ptr<Bipartition> *originalEdge,int originalID)

{
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *b;
  undefined4 in_EDX;
  undefined8 *in_RDI;
  undefined8 in_XMM0_Qa;
  shared_ptr<Bipartition> *in_stack_ffffffffffffff88;
  shared_ptr<Bipartition> *in_stack_ffffffffffffff90;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  allocator<unsigned_long> *alloc;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffe0;
  
  Bipartition::Bipartition((Bipartition *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
  *in_RDI = &PTR_toString_abi_cxx11__002c1b28;
  in_RDI[5] = in_XMM0_Qa;
  alloc = (allocator<unsigned_long> *)(in_RDI + 6);
  std::shared_ptr<Bipartition>::shared_ptr(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  *(undefined4 *)(in_RDI + 8) = in_EDX;
  std::__shared_ptr_access<Bipartition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Bipartition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1f8bba)
  ;
  b = (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
      Bipartition::size((Bipartition *)0x1f8bc2);
  this_00 = (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
            &stack0xffffffffffffffb3;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1f8bd8);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (in_stack_ffffffffffffffb0,(size_type)b,(unsigned_long)in_RDI,alloc);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (in_stack_ffffffffffffffb0,b);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset(this_00);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x1f8c1b);
  return;
}

Assistant:

PhyloTreeEdge::PhyloTreeEdge(double attrib, const shared_ptr<Bipartition>& originalEdge, int originalID) : originalEdge(originalEdge), originalID(originalID), length(attrib) {
    this->partition = boost::dynamic_bitset<>(originalEdge->size());
}